

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O3

void __thiscall KDIS::NETWORK::Connection::bindSocket(Connection *this)

{
  ushort uVar1;
  int iVar2;
  KException *pKVar3;
  int *piVar4;
  KCHAR8 *pKVar5;
  Connection *pCVar6;
  KINT32 yes;
  allocator<char> local_51;
  KString local_50;
  undefined4 local_2c;
  sockaddr local_28;
  
  local_2c = 1;
  iVar2 = setsockopt(this->m_iSocket[1],1,2,&local_2c,4);
  if (iVar2 == -1) {
    pCVar6 = (Connection *)0x30;
    pKVar3 = (KException *)__cxa_allocate_exception();
    piVar4 = __errno_location();
    pKVar5 = getErrorText(pCVar6,*piVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,pKVar5,(allocator<char> *)&local_28);
    KException::KException(pKVar3,&local_50,0xc);
    __cxa_throw(pKVar3,&KException::typeinfo,KException::~KException);
  }
  local_28.sa_data[6] = '\0';
  local_28.sa_data[7] = '\0';
  local_28.sa_data[8] = '\0';
  local_28.sa_data[9] = '\0';
  local_28.sa_data[10] = '\0';
  local_28.sa_data[0xb] = '\0';
  local_28.sa_data[0xc] = '\0';
  local_28.sa_data[0xd] = '\0';
  local_28.sa_family = 2;
  local_28.sa_data[2] = '\0';
  local_28.sa_data[3] = '\0';
  local_28.sa_data[4] = '\0';
  local_28.sa_data[5] = '\0';
  uVar1 = (ushort)this->m_uiPort;
  local_28.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
  iVar2 = bind(this->m_iSocket[1],&local_28,0x10);
  if (iVar2 != -1) {
    return;
  }
  pCVar6 = (Connection *)0x30;
  pKVar3 = (KException *)__cxa_allocate_exception();
  piVar4 = __errno_location();
  pKVar5 = getErrorText(pCVar6,*piVar4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pKVar5,&local_51);
  KException::KException(pKVar3,&local_50,0xc);
  __cxa_throw(pKVar3,&KException::typeinfo,KException::~KException);
}

Assistant:

void Connection::bindSocket()
{
    // Set the receive socket to be reusable. Useful if your server has
    // been shut down, and then restarted right away.
    KINT32 yes = 1;
    KINT32 iRet = setsockopt( m_iSocket[RECEIVE_SOCK], SOL_SOCKET, SO_REUSEADDR, ( const char * )&yes, sizeof( yes ) );
    if( iRet == SOCKET_ERROR )
    {
        THROW_ERROR;
    }

    // Construct bind structure
    sockaddr_in Address;
    memset( &Address, 0, sizeof( Address ) );
    Address.sin_family = AF_INET;                   // Internet address family
    Address.sin_addr.s_addr = htonl( INADDR_ANY );  // Any incoming interface
    Address.sin_port = htons( m_uiPort );           // Listen Port

    // Now bind
    iRet = bind( m_iSocket[RECEIVE_SOCK], ( sockaddr* )&Address, sizeof( Address ) );
    if( iRet == SOCKET_ERROR )
    {
        THROW_ERROR;
    }
}